

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserBase.cpp
# Opt level: O0

void __thiscall
slang::parsing::ParserBase::skipToken(ParserBase *this,optional<slang::DiagCode> diagCode)

{
  SourceRange range;
  bool bVar1;
  TokenKind TVar2;
  DiagCode *pDVar3;
  reference pTVar4;
  undefined8 in_RSI;
  undefined8 in_RDI;
  TokenKind newSkipKind;
  SmallVector<slang::parsing::TokenKind,_20UL> delimStack;
  TokenKind skipKind;
  bool haveDiag;
  Token token;
  ParserBase *in_stack_ffffffffffffff18;
  undefined6 in_stack_ffffffffffffff20;
  TokenKind in_stack_ffffffffffffff26;
  Window *in_stack_ffffffffffffff30;
  undefined7 in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff3f;
  SourceLocation in_stack_ffffffffffffff40;
  SourceLocation in_stack_ffffffffffffff48;
  DiagCode code;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  SmallVectorBase<slang::parsing::TokenKind> local_80 [2];
  TokenKind local_3a;
  SourceRange local_38;
  DiagCode local_26;
  byte local_21;
  Token local_20;
  undefined4 local_6;
  undefined2 local_2;
  
  code = SUB84((ulong)in_RDI >> 0x20,0);
  local_6 = (undefined4)in_RSI;
  local_2 = (undefined2)((ulong)in_RSI >> 0x20);
  local_20 = peek(in_stack_ffffffffffffff18);
  local_21 = haveDiagAtCurrentLoc
                       ((ParserBase *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60))
  ;
  SmallVectorBase<slang::parsing::Token>::push_back
            ((SmallVectorBase<slang::parsing::Token> *)
             CONCAT26(in_stack_ffffffffffffff26,in_stack_ffffffffffffff20),
             (Token *)in_stack_ffffffffffffff18);
  Window::moveToNext(in_stack_ffffffffffffff30);
  bVar1 = std::optional::operator_cast_to_bool((optional<slang::DiagCode> *)0x34f8af);
  if ((bVar1) && ((local_21 & 1) == 0)) {
    pDVar3 = std::optional<slang::DiagCode>::operator*((optional<slang::DiagCode> *)0x34f8cc);
    local_26 = *pDVar3;
    local_38 = Token::range((Token *)in_stack_ffffffffffffff40);
    range.endLoc = in_stack_ffffffffffffff48;
    range.startLoc = in_stack_ffffffffffffff40;
    addDiag((ParserBase *)CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38),code,range);
  }
  local_3a = slang::syntax::SyntaxFacts::getSkipToKind(local_20.kind);
  if (local_3a != Unknown) {
    SmallVector<slang::parsing::TokenKind,_20UL>::SmallVector
              ((SmallVector<slang::parsing::TokenKind,_20UL> *)0x34f942);
    while( true ) {
      local_20 = peek(in_stack_ffffffffffffff18);
      if (local_20.kind == EndOfFile) break;
      bVar1 = slang::syntax::SyntaxFacts::isEndKeyword(local_20.kind);
      if (bVar1) {
        while (local_20.kind != local_3a) {
          bVar1 = SmallVectorBase<slang::parsing::TokenKind>::empty(local_80);
          if (bVar1) goto LAB_0034fb0d;
          in_stack_ffffffffffffff30 =
               (Window *)SmallVectorBase<slang::parsing::TokenKind>::back(local_80);
          local_3a = *(TokenKind *)&in_stack_ffffffffffffff30->tokenSource;
          SmallVectorBase<slang::parsing::TokenKind>::pop_back
                    ((SmallVectorBase<slang::parsing::TokenKind> *)
                     CONCAT26(in_stack_ffffffffffffff26,in_stack_ffffffffffffff20));
        }
      }
      SmallVectorBase<slang::parsing::Token>::push_back
                ((SmallVectorBase<slang::parsing::Token> *)
                 CONCAT26(in_stack_ffffffffffffff26,in_stack_ffffffffffffff20),
                 (Token *)in_stack_ffffffffffffff18);
      Window::moveToNext(in_stack_ffffffffffffff30);
      if (local_20.kind == local_3a) {
        bVar1 = SmallVectorBase<slang::parsing::TokenKind>::empty(local_80);
        if (bVar1) break;
        pTVar4 = SmallVectorBase<slang::parsing::TokenKind>::back(local_80);
        local_3a = *pTVar4;
        SmallVectorBase<slang::parsing::TokenKind>::pop_back
                  ((SmallVectorBase<slang::parsing::TokenKind> *)
                   CONCAT26(in_stack_ffffffffffffff26,in_stack_ffffffffffffff20));
      }
      else {
        TVar2 = slang::syntax::SyntaxFacts::getSkipToKind(local_20.kind);
        in_stack_ffffffffffffff26 = TVar2;
        if (TVar2 != Unknown) {
          SmallVectorBase<slang::parsing::TokenKind>::push_back
                    ((SmallVectorBase<slang::parsing::TokenKind> *)
                     CONCAT26(TVar2,in_stack_ffffffffffffff20),
                     (TokenKind *)in_stack_ffffffffffffff18);
          local_3a = TVar2;
        }
      }
    }
LAB_0034fb0d:
    SmallVector<slang::parsing::TokenKind,_20UL>::~SmallVector
              ((SmallVector<slang::parsing::TokenKind,_20UL> *)0x34fb17);
  }
  return;
}

Assistant:

void ParserBase::skipToken(std::optional<DiagCode> diagCode) {
    auto token = peek();
    SLANG_ASSERT(token.kind != TokenKind::EndOfFile);

    bool haveDiag = haveDiagAtCurrentLoc();
    skippedTokens.push_back(token);
    window.moveToNext();

    if (diagCode && !haveDiag)
        addDiag(*diagCode, token.range());

    // If the token we're skipping is an opening paren / bracket / brace,
    // skip everything up to the corresponding closing token, otherwise we're
    // pretty much guaranteed to report a bunch of spurious errors inside it.
    TokenKind skipKind = SF::getSkipToKind(token.kind);
    if (skipKind == TokenKind::Unknown)
        return;

    SmallVector<TokenKind> delimStack;
    while (true) {
        token = peek();
        if (token.kind == TokenKind::EndOfFile)
            return;

        // If this is an end keyword but not the one we're looking for,
        // it probably matches something higher in our stack so don't
        // necessarily consume it.
        if (SF::isEndKeyword(token.kind)) {
            while (token.kind != skipKind) {
                if (delimStack.empty())
                    return;

                skipKind = delimStack.back();
                delimStack.pop_back();
            }
        }

        skippedTokens.push_back(token);
        window.moveToNext();

        if (token.kind == skipKind) {
            if (delimStack.empty())
                return;

            skipKind = delimStack.back();
            delimStack.pop_back();
        }
        else {
            TokenKind newSkipKind = SF::getSkipToKind(token.kind);
            if (newSkipKind != TokenKind::Unknown) {
                delimStack.push_back(skipKind);
                skipKind = newSkipKind;
            }
        }
    }
}